

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::parseEntity(QXmlStreamReaderPrivate *this,QString *value)

{
  bool bVar1;
  pointer pQVar2;
  qsizetype qVar3;
  EVP_PKEY_CTX *in_RSI;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  QXmlStreamReader *q;
  QXmlStreamReaderPrivate *in_stack_000005d8;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  ushort in_stack_ffffffffffffff8e;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff90;
  QXmlStreamReaderPrivate *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  QXmlStreamReader *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = q_func(in_RDI);
  bVar1 = QString::isEmpty((QString *)0x64543e);
  if (!bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                        *)0x64545a);
    if (bVar1) {
      pQVar2 = std::
               unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
               operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                           *)0x6454a0);
      init(pQVar2,in_RSI);
    }
    else {
      std::make_unique<QXmlStreamReaderPrivate,QXmlStreamReader*const&>((QXmlStreamReader **)in_RDI)
      ;
      std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      operator=((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                 *)in_stack_ffffffffffffff90,
                (unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                 *)CONCAT26(in_stack_ffffffffffffff8e,
                            CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
      std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      ~unique_ptr((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                   *)in_stack_ffffffffffffff90);
    }
    pQVar2 = std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             ::operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                           *)0x6454b9);
    *(ushort *)&pQVar2->field_0x3a8 = *(ushort *)&pQVar2->field_0x3a8 & 0xff7f | 0x80;
    std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
    operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *
               )0x6454ec);
    QString::operator=((QString *)in_stack_ffffffffffffff90,
                       (QString *)
                       CONCAT26(in_stack_ffffffffffffff8e,
                                CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
    std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
    operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *
               )0x645511);
    injectToken(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e);
    while( true ) {
      pQVar2 = std::
               unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
               operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                           *)0x64552f);
      uVar4 = false;
      if ((pQVar2->atEnd & 1U) == 0) {
        pQVar2 = std::
                 unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                 ::operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                               *)0x645552);
        uVar4 = pQVar2->type != Invalid;
      }
      if ((bool)uVar4 == false) break;
      std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
      operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                  *)0x64557b);
      parse(in_stack_000005d8);
    }
    pQVar2 = std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
             ::operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                           *)0x645596);
    if (pQVar2->type != Invalid) {
      pQVar2 = std::
               unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
               operator->((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
                           *)0x6455b0);
      qVar3 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::size
                        (&(pQVar2->super_QXmlStreamPrivateTagStack).tagStack);
      if (qVar3 == 0) goto LAB_0064561c;
    }
    this_00 = (QXmlStreamReaderPrivate *)&stack0xffffffffffffffd0;
    QXmlStream::tr((char *)CONCAT17(uVar4,in_stack_ffffffffffffff98),(char *)this_00,
                   CONCAT22(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c));
    raiseWellFormedError
              (this_00,(QString *)
                       CONCAT26(in_stack_ffffffffffffff8e,
                                CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
    QString::~QString((QString *)0x6455fc);
  }
LAB_0064561c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::parseEntity(const QString &value)
{
    Q_Q(QXmlStreamReader);

    if (value.isEmpty())
        return;


    if (!entityParser)
        entityParser = std::make_unique<QXmlStreamReaderPrivate>(q);
    else
        entityParser->init();
    entityParser->inParseEntity = true;
    entityParser->readBuffer = value;
    entityParser->injectToken(PARSE_ENTITY);
    while (!entityParser->atEnd && entityParser->type != QXmlStreamReader::Invalid)
        entityParser->parse();
    if (entityParser->type == QXmlStreamReader::Invalid || entityParser->tagStack.size())
        raiseWellFormedError(QXmlStream::tr("Invalid entity value."));

}